

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateClone
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  
  io::Printer::Print(printer,"@Override\npublic $classname$ clone() {\n","classname",
                     *(string **)this->descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "$classname$ cloned;\ntry {\n  cloned = ($classname$) super.clone();\n} catch (java.lang.CloneNotSupportedException e) {\n  throw new java.lang.AssertionError(e);\n}\n"
                     ,"classname",*(string **)this->descriptor_);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(this->descriptor_ + 0x2c); lVar3 = lVar3 + 1) {
    pFVar1 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar2));
    (*pFVar1->_vptr_FieldGenerator[0xc])(pFVar1,printer);
    lVar2 = lVar2 + 0xa8;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return cloned;\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateClone(io::Printer* printer) {
  printer->Print(
    "@Override\n"
    "public $classname$ clone() {\n",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "$classname$ cloned;\n"
    "try {\n"
    "  cloned = ($classname$) super.clone();\n"
    "} catch (java.lang.CloneNotSupportedException e) {\n"
    "  throw new java.lang.AssertionError(e);\n"
    "}\n",
    "classname", descriptor_->name());

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateFixClonedCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "  return cloned;\n"
    "}\n"
    "\n");
}